

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_add_tet(REF_CAVITY ref_cavity,REF_INT tet)

{
  REF_CELL pRVar1;
  REF_NODE pRVar2;
  uint uVar3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT already_have_it;
  REF_INT face_nodes [3];
  REF_INT node;
  REF_INT cell_face;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT tet_local;
  REF_CAVITY ref_cavity_local;
  
  pRVar1 = ref_cavity->ref_grid->cell[8];
  pRVar2 = ref_cavity->ref_grid->node;
  if (((tet < 0) || (pRVar1->max <= tet)) || (pRVar1->c2n[pRVar1->size_per * tet] == -1)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x231,
           "ref_cavity_add_tet","invalid tet");
    ref_cavity_local._4_4_ = 1;
  }
  else {
    ref_cavity_local._4_4_ =
         ref_list_contains(ref_cavity->tet_list,tet,&ref_private_macro_code_rss_1);
    if (ref_cavity_local._4_4_ == 0) {
      if (ref_private_macro_code_rss_1 == 0) {
        ref_cavity_local._4_4_ = ref_list_push(ref_cavity->tet_list,tet);
        if (ref_cavity_local._4_4_ == 0) {
          for (face_nodes[2] = 0; face_nodes[2] < pRVar1->face_per;
              face_nodes[2] = face_nodes[2] + 1) {
            for (face_nodes[1] = 0; face_nodes[1] < 3; face_nodes[1] = face_nodes[1] + 1) {
              (&ref_private_macro_code_rss)[face_nodes[1]] =
                   pRVar1->c2n
                   [pRVar1->f2n[face_nodes[1] + face_nodes[2] * 4] + pRVar1->size_per * tet];
              if (pRVar2->ref_mpi->id != pRVar2->part[(&ref_private_macro_code_rss)[face_nodes[1]]])
              {
                ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
                return 0;
              }
            }
            uVar3 = ref_cavity_insert_face(ref_cavity,&ref_private_macro_code_rss);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x241,"ref_cavity_add_tet",(ulong)uVar3,"tet side");
              return uVar3;
            }
            if (ref_cavity->state != REF_CAVITY_UNKNOWN) {
              return 0;
            }
          }
          ref_cavity_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x237,"ref_cavity_add_tet",(ulong)ref_cavity_local._4_4_,"save tet");
        }
      }
      else {
        ref_cavity_local._4_4_ = 0;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x234,"ref_cavity_add_tet",(ulong)ref_cavity_local._4_4_,"have tet?");
    }
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_add_tet(REF_CAVITY ref_cavity, REF_INT tet) {
  REF_CELL ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_INT cell_face, node;
  REF_INT face_nodes[3];
  REF_INT already_have_it;

  RAS(ref_cell_valid(ref_cell, tet), "invalid tet");

  RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), tet, &already_have_it),
      "have tet?");
  if (already_have_it) return REF_SUCCESS;

  RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), tet), "save tet");

  each_ref_cell_cell_face(ref_cell, cell_face) {
    each_ref_cavity_face_node(ref_cavity, node) {
      face_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, tet);
      if (!ref_node_owned(ref_node, face_nodes[node])) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }
    RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
    if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_SUCCESS;
  }

  return REF_SUCCESS;
}